

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::CreationErrorTest::CheckError
          (CreationErrorTest *this,GLenum expected,GLchar *log_message)

{
  ostringstream *this_00;
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 != expected) {
    local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,log_message);
    std::operator<<((ostream *)this_00," ");
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this_00);
    std::operator<<((ostream *)this_00,"was observed instead.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return GVar2 == expected;
}

Assistant:

bool CreationErrorTest::CheckError(const glw::GLenum expected, const glw::GLchar* log_message)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLenum error = 0;

	if (expected != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << log_message << " " << glu::getErrorStr(error)
											<< "was observed instead." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}